

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu541.c
# Opt level: O0

MPP_RET hal_h264e_vepu541_gen_regs(void *hal,HalEncTask *task)

{
  MppEncCfgSet *cfg_00;
  H264eSps *sps_00;
  H264ePps *pps_00;
  H264eSlice *slice_00;
  RK_U32 RVar1;
  Vepu541H264eRegSet *regs_00;
  EncFrmStatus *pEVar2;
  int local_7c;
  int local_78;
  RK_S32 i;
  RK_S32 n;
  RK_U32 *p;
  EncFrmStatus *frm_status;
  MPP_RET ret;
  H264eSlice *slice;
  H264ePps *pps;
  H264eSps *sps;
  MppEncPrepCfg *prep;
  MppEncCfgSet *cfg;
  Vepu541H264eRegSet *regs;
  HalH264eVepu541Ctx *ctx;
  HalEncTask *task_local;
  void *hal_local;
  
  regs_00 = (Vepu541H264eRegSet *)((long)hal + 0x1b8);
  cfg_00 = *hal;
  sps_00 = *(H264eSps **)((long)hal + 0x38);
  pps_00 = *(H264ePps **)((long)hal + 0x40);
  slice_00 = *(H264eSlice **)((long)hal + 0x48);
  pEVar2 = &task->rc_task->frm;
  if ((hal_h264e_debug & 2) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","enter %p\n","hal_h264e_vepu541_gen_regs",hal);
  }
  if ((hal_h264e_debug & 8) != 0) {
    _mpp_log_l(4,"hal_h264e_vepu541","frame %d generate regs now","hal_h264e_vepu541_gen_regs",
               (ulong)**(uint **)((long)hal + 0x50));
  }
  memset(regs_00,0,0x348);
  setup_vepu541_normal(regs_00,*(RK_U32 *)((long)hal + 0x10));
  hal_local._4_4_ = setup_vepu541_prep(regs_00,(MppEncPrepCfg *)(*hal + 8),task);
  if (hal_local._4_4_ == MPP_OK) {
    setup_vepu541_codec(regs_00,sps_00,pps_00,slice_00);
    setup_vepu541_rdo_pred(regs_00,sps_00,pps_00,slice_00,cfg_00);
    setup_vepu541_rc_base(regs_00,sps_00,slice_00,&cfg_00->hw,task->rc_task);
    setup_vepu541_io_buf(regs_00,*(MppDev *)((long)hal + 8),task);
    setup_vepu541_roi(regs_00,(HalH264eVepu541Ctx *)hal);
    setup_vepu541_recn_refr
              (regs_00,*(MppDev *)((long)hal + 8),*(H264eFrmInfo **)((long)hal + 0x50),
               *(HalBufs *)((long)hal + 0x18),*(RK_S32 *)((long)hal + 0x20));
    if (task->md_info == (MppBuffer)0x0) {
      local_7c = 0;
    }
    else {
      local_7c = mpp_buffer_get_fd_with_caller(task->md_info,"hal_h264e_vepu541_gen_regs");
    }
    *(int *)((long)hal + 0x300) = local_7c;
    RVar1 = mpp_frame_get_offset_y(task->frame);
    *(uint *)((long)hal + 0x2c8) = *(uint *)((long)hal + 0x2c8) & 0xffffe000 | RVar1 & 0x1fff;
    RVar1 = mpp_frame_get_offset_x(task->frame);
    *(uint *)((long)hal + 0x2c8) =
         *(uint *)((long)hal + 0x2c8) & 0xe000ffff | (RVar1 & 0x1fff) << 0x10;
    setup_vepu541_split(regs_00,&cfg_00->split);
    if ((*(int *)((long)hal + 0x10) != 0) && (0x780 < (cfg_00->prep).width)) {
      setup_vepu540_force_slice_split(regs_00,(cfg_00->prep).width);
    }
    setup_vepu541_me(regs_00,sps_00,slice_00,*(RK_U32 *)((long)hal + 0x10));
    if ((pEVar2->val >> 0x26 & 1) != 0) {
      setup_vepu541_intra_refresh
                (regs_00,(HalH264eVepu541Ctx *)hal,
                 (RK_U32)((long)(pEVar2->val >> 0x30) % (long)(cfg_00->rc).gop));
    }
    if (*(int *)((long)hal + 0x10) == 0) {
      vepu541_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
    }
    else {
      vepu540_set_osd((Vepu541OsdCfg *)((long)hal + 0x188));
    }
    setup_vepu541_l2((Vepu541H264eRegL2Set *)((long)hal + 0x500),slice_00,&cfg_00->hw,cfg_00);
    mpp_env_get_u32("dump_l1_reg",&dump_l1_reg,0);
    if (dump_l1_reg != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","L1 reg dump start:\n",(char *)0x0);
      for (local_78 = 0; local_78 < 0x74; local_78 = local_78 + 1) {
        _mpp_log_l(4,"hal_h264e_vepu541","%04x %08x\n",(char *)0x0,(ulong)(uint)(local_78 << 2),
                   (ulong)regs_00->reg_008_011[(long)local_78 + -8]);
      }
      _mpp_log_l(4,"hal_h264e_vepu541","L1 reg done\n",(char *)0x0);
    }
    *(int *)((long)hal + 0x14) = *(int *)((long)hal + 0x14) + 1;
    if ((hal_h264e_debug & 2) != 0) {
      _mpp_log_l(4,"hal_h264e_vepu541","leave %p\n","hal_h264e_vepu541_gen_regs",hal);
    }
    hal_local._4_4_ = MPP_OK;
  }
  return hal_local._4_4_;
}

Assistant:

static MPP_RET hal_h264e_vepu541_gen_regs(void *hal, HalEncTask *task)
{
    HalH264eVepu541Ctx *ctx = (HalH264eVepu541Ctx *)hal;
    Vepu541H264eRegSet *regs = &ctx->regs_set;
    MppEncCfgSet *cfg = ctx->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    H264eSps *sps = ctx->sps;
    H264ePps *pps = ctx->pps;
    H264eSlice *slice = ctx->slice;
    MPP_RET ret = MPP_OK;
    EncFrmStatus *frm_status = &task->rc_task->frm;

    hal_h264e_dbg_func("enter %p\n", hal);
    hal_h264e_dbg_detail("frame %d generate regs now", ctx->frms->seq_idx);

    /* register setup */
    memset(regs, 0, sizeof(*regs));

    setup_vepu541_normal(regs, ctx->is_vepu540);
    ret = setup_vepu541_prep(regs, &ctx->cfg->prep, task);
    if (ret)
        return ret;

    setup_vepu541_codec(regs, sps, pps, slice);
    setup_vepu541_rdo_pred(regs, sps, pps, slice, cfg);
    setup_vepu541_rc_base(regs, sps, slice, &cfg->hw, task->rc_task);
    setup_vepu541_io_buf(regs, ctx->dev, task);
    setup_vepu541_roi(regs, ctx);
    setup_vepu541_recn_refr(regs, ctx->dev, ctx->frms, ctx->hw_recn,
                            ctx->pixel_buf_fbc_hdr_size);

    regs->reg082.meiw_addr = task->md_info ? mpp_buffer_get_fd(task->md_info) : 0;

    regs->reg068.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->reg068.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    setup_vepu541_split(regs, &cfg->split);
    if (ctx->is_vepu540 && prep->width > 1920)
        setup_vepu540_force_slice_split(regs, prep->width);

    setup_vepu541_me(regs, sps, slice, ctx->is_vepu540);

    if (frm_status->is_i_refresh)
        setup_vepu541_intra_refresh(regs, ctx, frm_status->seq_idx % cfg->rc.gop);

    if (ctx->is_vepu540)
        vepu540_set_osd(&ctx->osd_cfg);
    else
        vepu541_set_osd(&ctx->osd_cfg);

    setup_vepu541_l2(&ctx->regs_l2_set, slice, &cfg->hw, cfg);

    mpp_env_get_u32("dump_l1_reg", &dump_l1_reg, 0);

    if (dump_l1_reg) {
        mpp_log("L1 reg dump start:\n");
        RK_U32 *p = (RK_U32 *)regs;
        RK_S32 n = 0x1D0 / sizeof(RK_U32);
        RK_S32 i;

        for (i = 0; i < n; i++)
            mpp_log("%04x %08x\n", i * 4, p[i]);

        mpp_log("L1 reg done\n");
    }

    ctx->frame_cnt++;

    hal_h264e_dbg_func("leave %p\n", hal);
    return MPP_OK;
}